

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall args::ArgumentParser::LongSeparator(ArgumentParser *this,string *longseparator_)

{
  UsageError *this_00;
  allocator local_39;
  string errorMessage;
  
  if (longseparator_->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this->longseparator);
    if (this->allowJoinedLongValue == true) {
      std::__cxx11::string::string((string *)&errorMessage,(string *)longseparator_);
    }
    else {
      std::__cxx11::string::string((string *)&errorMessage," ",&local_39);
    }
    std::__cxx11::string::_M_assign((string *)&(this->helpParams).longSeparator);
    std::__cxx11::string::~string((string *)&errorMessage);
    return;
  }
  std::__cxx11::string::string
            ((string *)&errorMessage,"longseparator can not be set to empty",&local_39);
  this_00 = (UsageError *)__cxa_allocate_exception(0x10);
  UsageError::UsageError(this_00,&errorMessage);
  __cxa_throw(this_00,&UsageError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename std::enable_if<!IsConvertableToString<T>::value, std::string>::type
        ToString(const T &)
        {
            return {};
        }